

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

void __thiscall caffe::PReLUParameter::SharedCtor(PReLUParameter *this)

{
  *(undefined8 *)((long)&this->filler_ + 1) = 0;
  *(undefined8 *)&this->_cached_size_ = 0;
  return;
}

Assistant:

void PReLUParameter::SharedCtor() {
  _cached_size_ = 0;
  ::memset(&filler_, 0, reinterpret_cast<char*>(&channel_shared_) -
    reinterpret_cast<char*>(&filler_) + sizeof(channel_shared_));
}